

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall
edition_unittest::TestRecursiveMessage::~TestRecursiveMessage(TestRecursiveMessage *this)

{
  TestRecursiveMessage *this_local;
  
  ~TestRecursiveMessage(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TestRecursiveMessage::~TestRecursiveMessage() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestRecursiveMessage)
  SharedDtor(*this);
}